

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColecoVision.cpp
# Opt level: O0

HalfCycles __thiscall
Coleco::Vision::ConcreteMachine::perform_machine_cycle
          (ConcreteMachine *this,PartialMachineCycle *cycle)

{
  bool bVar1;
  uint8_t uVar2;
  ushort uVar3;
  pointer pTVar4;
  reference pvVar5;
  ssize_t sVar6;
  reference this_00;
  uint *puVar7;
  void *__buf;
  void *__buf_00;
  uint local_fc;
  HalfCycles local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [28];
  int eighth;
  Joystick *joystick;
  size_t joystick_id;
  undefined1 local_90 [16];
  undefined1 local_80 [30];
  uint16_t address;
  undefined1 local_50 [32];
  HalfCycles length;
  HalfCycles local_28;
  PartialMachineCycle *local_20;
  PartialMachineCycle *cycle_local;
  ConcreteMachine *this_local;
  HalfCycles penalty;
  
  local_20 = cycle;
  cycle_local = (PartialMachineCycle *)this;
  HalfCycles::HalfCycles((HalfCycles *)&this_local,0);
  if ((local_20->operation == Output) && (((int)(uint)*local_20->address >> 5 & 7U) == 7)) {
    HalfCycles::HalfCycles(&local_28,0x3e);
    this_local = (ConcreteMachine *)local_28.super_WrappedInt<HalfCycles>.length_;
  }
  else if (local_20->operation == ReadOpcode) {
    HalfCycles::HalfCycles(&length,2);
    this_local = (ConcreteMachine *)length.super_WrappedInt<HalfCycles>.length_;
  }
  local_50._16_8_ =
       WrappedInt<HalfCycles>::operator+
                 (&(local_20->length).super_WrappedInt<HalfCycles>,(HalfCycles *)&this_local);
  local_50._24_8_ = local_50._16_8_;
  bVar1 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator+=
                    (&this->vdp_,(HalfCycles)local_50._16_8_);
  if (bVar1) {
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
               local_50);
    pTVar4 = std::
             unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                           *)local_50);
    bVar1 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar4);
    HalfCycles::HalfCycles((HalfCycles *)(local_80 + 0x18),0);
    CPU::Z80::ProcessorBase::set_non_maskable_interrupt_line
              (&(this->z80_).super_ProcessorBase,bVar1,(HalfCycles)stack0xffffffffffffff98);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_50);
  }
  WrappedInt<HalfCycles>::operator+=
            (&(this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>,
             (HalfCycles *)(local_50 + 0x18));
  bVar1 = CPU::Z80::PartialMachineCycle::is_terminal(local_20);
  if (bVar1) {
    if (local_20->address == (uint16_t *)0x0) {
      local_fc = 0;
    }
    else {
      local_fc = (uint)*local_20->address;
    }
    uVar3 = (ushort)local_fc;
    puVar7 = &switchD_006f1d8f::switchdataD_00a4e500;
    local_80[0x16] = (char)local_fc;
    local_80._22_2_ = uVar3;
    switch(local_20->operation) {
    case ReadOpcode:
      if (uVar3 == 0) {
        this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
      }
    case Read:
      if (uVar3 < 0x2000) {
        if (((this->super_game_module_).replace_bios & 1U) == 0) {
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->bios_,(ulong)uVar3);
          *local_20->value = *pvVar5;
        }
        else {
          *local_20->value = (this->super_game_module_).ram[uVar3];
        }
      }
      else if ((((this->super_game_module_).replace_ram & 1U) == 0) || (0x7fff < uVar3)) {
        if ((uVar3 < 0x6000) || (0x7fff < uVar3)) {
          if ((uVar3 < 0x8000) || (this->cartridge_address_limit_ < local_fc)) {
            *local_20->value = 0xff;
          }
          else {
            if (((this->is_megacart_ & 1U) != 0) && (0xffbf < uVar3)) {
              page_megacart(this,uVar3);
            }
            *local_20->value =
                 this->cartridge_pages_[(int)((int)(uint)(ushort)local_80._22_2_ >> 0xe & 1)]
                 [(int)((ushort)local_80._22_2_ & 0x3fff)];
          }
        }
        else {
          *local_20->value = this->ram_[(int)(local_fc & 0x3ff)];
        }
      }
      else {
        *local_20->value = (this->super_game_module_).ram[uVar3];
      }
      break;
    case Write:
      if ((((this->super_game_module_).replace_bios & 1U) == 0) || (0x1fff < uVar3)) {
        if ((((this->super_game_module_).replace_ram & 1U) == 0) ||
           ((uVar3 < 0x2000 || (0x7fff < uVar3)))) {
          if ((uVar3 < 0x6000) || (0x7fff < uVar3)) {
            if (((this->is_megacart_ & 1U) != 0) && (0xffbf < uVar3)) {
              page_megacart(this,uVar3);
            }
          }
          else {
            this->ram_[(int)(local_fc & 0x3ff)] = *local_20->value;
          }
        }
        else {
          (this->super_game_module_).ram[uVar3] = *local_20->value;
        }
      }
      else {
        (this->super_game_module_).ram[uVar3] = *local_20->value;
      }
      break;
    case Input:
      uVar3 = uVar3 >> 5 & 7;
      if (uVar3 == 5) {
        JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   local_80);
        pTVar4 = std::
                 unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                               *)local_80);
        sVar6 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read
                          (pTVar4,(uint)(ushort)local_80._22_2_,__buf,(size_t)puVar7);
        *local_20->value = (uint8_t)sVar6;
        std::
        unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_80);
        JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   local_90);
        pTVar4 = std::
                 unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                               *)local_90);
        bVar1 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar4);
        HalfCycles::HalfCycles((HalfCycles *)&joystick_id,0);
        CPU::Z80::ProcessorBase::set_non_maskable_interrupt_line
                  (&(this->z80_).super_ProcessorBase,bVar1,(HalfCycles)joystick_id);
        std::
        unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_90);
      }
      else if (uVar3 == 7) {
        joystick = (Joystick *)(long)((int)(local_fc & 2) >> 1);
        this_00 = std::
                  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                  ::operator[](&this->joysticks_,(size_type)joystick);
        register0x00000000 =
             (Flywheel *)
             std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>::get(this_00)
        ;
        if ((this->joysticks_in_keypad_mode_ & 1U) == 0) {
          uVar2 = Vision::Joystick::get_direction_input((Joystick *)register0x00000000);
          *local_20->value = uVar2;
        }
        else {
          uVar2 = Vision::Joystick::get_keypad_input((Joystick *)register0x00000000);
          *local_20->value = uVar2;
        }
        if ((local_80._22_2_ & 0xfc) == 0xfc) {
          Analyser::Dynamic::ConfidenceCounter::add_hit(&this->confidence_counter_);
        }
      }
      else if (local_80[0x16] == 'R') {
        update_audio(this);
        uVar2 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&this->ay_);
        *local_20->value = uVar2;
      }
      else {
        *local_20->value = 0xff;
      }
      break;
    case Output:
      local_c0._20_4_ = uVar3 >> 5 & 7;
      puVar7 = &switchD_006f228f::switchdataD_00a4e514;
      switch(local_c0._20_4_) {
      case 4:
      case 6:
        this->joysticks_in_keypad_mode_ = local_c0._20_4_ == 4;
        break;
      case 5:
        JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   local_c0);
        pTVar4 = std::
                 unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                               *)local_c0);
        TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                  (pTVar4,(uint)(ushort)local_80._22_2_,(void *)(ulong)*local_20->value,
                   (size_t)puVar7);
        std::
        unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_c0);
        JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                  ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   local_d0);
        pTVar4 = std::
                 unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                               *)local_d0);
        bVar1 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar4);
        HalfCycles::HalfCycles(&local_d8,0);
        CPU::Z80::ProcessorBase::set_non_maskable_interrupt_line
                  (&(this->z80_).super_ProcessorBase,bVar1,local_d8);
        std::
        unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_d0);
        break;
      case 7:
        update_audio(this);
        TI::SN76489::write(&this->sn76489_,(uint)*local_20->value,__buf_00,(size_t)puVar7);
        break;
      default:
        local_fc = local_fc & 0xff;
        if (local_fc == 0x50) {
          update_audio(this);
          GI::AY38910::Utility::select_register<GI::AY38910::AY38910<false>>
                    (&this->ay_,*local_20->value);
        }
        else if (local_fc == 0x51) {
          update_audio(this);
          GI::AY38910::Utility::write_data<GI::AY38910::AY38910<false>>(&this->ay_,*local_20->value)
          ;
        }
        else if (local_fc == 0x53) {
          (this->super_game_module_).replace_ram = (*local_20->value & 1) != 0;
        }
        else if (local_fc == 0x7f) {
          (this->super_game_module_).replace_bios =
               (bool)(((*local_20->value & 2) != 0 ^ 0xffU) & 1);
        }
      }
    }
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// The SN76489 will use its ready line to trigger the Z80's wait, which will add
			// thirty-one (!) cycles when accessed. M1 cycles are extended by a single cycle.
			// This code works out the delay up front in order to simplify execution flow, though
			// technically this is a little duplicative.
			HalfCycles penalty(0);
			if(cycle.operation == CPU::Z80::PartialMachineCycle::Output && ((*cycle.address >> 5) & 7) == 7) {
				penalty = HalfCycles(62);
			} else if(cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) {
				penalty = HalfCycles(2);
			}
			const HalfCycles length = cycle.length + penalty;

			if(vdp_ += length) {
				z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
			}
			time_since_sn76489_update_ += length;

			// Act only if necessary.
			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(!address) pc_zero_accesses_++;
						[[fallthrough]];
					case CPU::Z80::PartialMachineCycle::Read:
						if(address < 0x2000) {
							if(super_game_module_.replace_bios) {
								*cycle.value = super_game_module_.ram[address];
							} else {
								*cycle.value = bios_[address];
							}
						} else if(super_game_module_.replace_ram && address < 0x8000) {
							*cycle.value = super_game_module_.ram[address];
						} else if(address >= 0x6000 && address < 0x8000) {
							*cycle.value = ram_[address & 1023];
						} else if(address >= 0x8000 && address <= cartridge_address_limit_) {
							if(is_megacart_ && address >= 0xffc0) {
								page_megacart(address);
							}
							*cycle.value = cartridge_pages_[(address >> 14)&1][address&0x3fff];
						} else {
							*cycle.value = 0xff;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write:
						if(super_game_module_.replace_bios && address < 0x2000) {
							super_game_module_.ram[address] = *cycle.value;
						} else if(super_game_module_.replace_ram && address >= 0x2000 && address < 0x8000) {
							super_game_module_.ram[address] = *cycle.value;
						} else if(address >= 0x6000 && address < 0x8000) {
							ram_[address & 1023] = *cycle.value;
						} else if(is_megacart_ && address >= 0xffc0) {
							page_megacart(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch((address >> 5) & 7) {
							case 5:
								*cycle.value = vdp_->read(address);
								z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 7: {
								const std::size_t joystick_id = (address&2) >> 1;
								Joystick *joystick = static_cast<Joystick *>(joysticks_[joystick_id].get());
								if(joysticks_in_keypad_mode_) {
									*cycle.value = joystick->get_keypad_input();
								} else {
									*cycle.value = joystick->get_direction_input();
								}

								// Hitting exactly the recommended joypad input port is an indicator that
								// this really is a ColecoVision game. The BIOS won't do this when just waiting
								// to start a game (unlike accessing the VDP and SN).
								if((address&0xfc) == 0xfc) confidence_counter_.add_hit();
							} break;

							default:
								switch(address&0xff) {
									default: *cycle.value = 0xff; break;
									case 0x52:
										// Read AY data.
										update_audio();
										*cycle.value = GI::AY38910::Utility::read(ay_);
									break;
								}
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int eighth = (address >> 5) & 7;
						switch(eighth) {
							case 4: case 6:
								joysticks_in_keypad_mode_ = eighth == 4;
							break;

							case 5:
								vdp_->write(address, *cycle.value);
								z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 7:
								update_audio();
								sn76489_.write(*cycle.value);
							break;

							default:
								// Catch Super Game Module accesses; it decodes more thoroughly.
								switch(address&0xff) {
									default: break;
									case 0x7f:
										super_game_module_.replace_bios = !((*cycle.value)&0x2);
									break;
									case 0x50:
										// Set AY address.
										update_audio();
										GI::AY38910::Utility::select_register(ay_, *cycle.value);
									break;
									case 0x51:
										// Set AY data.
										update_audio();
										GI::AY38910::Utility::write_data(ay_, *cycle.value);
									break;
									case 0x53:
										super_game_module_.replace_ram = !!((*cycle.value)&0x1);
									break;
								}
							break;
						}
					} break;

					default: break;
				}
			}

			return penalty;
		}